

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void __thiscall tinygltf::Animation::~Animation(Animation *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->extensions_json_string)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->extensions_json_string).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->extras_json_string)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->extras_json_string).field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::~_Rb_tree(&(this->extensions)._M_t);
  Value::~Value(&this->extras);
  std::vector<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>::~vector
            (&this->samplers);
  std::vector<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>::~vector
            (&this->channels);
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Animation() = default;